

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_x509a.cc
# Opt level: O0

int X509_CERT_AUX_print(BIO *bp,X509_CERT_AUX *x,int indent)

{
  bool bVar1;
  size_t sVar2;
  ASN1_OBJECT *pAVar3;
  char *pcVar4;
  int local_8c;
  ulong uStack_88;
  int j;
  size_t i;
  char local_78 [7];
  char first;
  char oidstr [80];
  int indent_local;
  X509_CERT_AUX *aux_local;
  BIO *out_local;
  
  if (x != (X509_CERT_AUX *)0x0) {
    oidstr._76_4_ = indent;
    if (x->trust == (stack_st_ASN1_OBJECT *)0x0) {
      BIO_printf(bp,"%*sNo Trusted Uses.\n",(ulong)(uint)indent,"");
    }
    else {
      bVar1 = true;
      BIO_printf(bp,"%*sTrusted Uses:\n%*s",(ulong)(uint)indent,"",(ulong)(indent + 2));
      for (uStack_88 = 0; sVar2 = sk_ASN1_OBJECT_num((stack_st_ASN1_OBJECT *)x->trust),
          uStack_88 < sVar2; uStack_88 = uStack_88 + 1) {
        if (bVar1) {
          bVar1 = false;
        }
        else {
          BIO_puts(bp,", ");
        }
        pAVar3 = (ASN1_OBJECT *)sk_ASN1_OBJECT_value((stack_st_ASN1_OBJECT *)x->trust,uStack_88);
        OBJ_obj2txt(local_78,0x50,pAVar3,0);
        BIO_puts(bp,local_78);
      }
      BIO_puts(bp,"\n");
    }
    if (x->reject == (stack_st_ASN1_OBJECT *)0x0) {
      BIO_printf(bp,"%*sNo Rejected Uses.\n",(ulong)(uint)oidstr._76_4_,"");
    }
    else {
      bVar1 = true;
      BIO_printf(bp,"%*sRejected Uses:\n%*s",(ulong)(uint)oidstr._76_4_,"",
                 (ulong)(oidstr._76_4_ + 2));
      for (uStack_88 = 0; sVar2 = sk_ASN1_OBJECT_num((stack_st_ASN1_OBJECT *)x->reject),
          uStack_88 < sVar2; uStack_88 = uStack_88 + 1) {
        if (bVar1) {
          bVar1 = false;
        }
        else {
          BIO_puts(bp,", ");
        }
        pAVar3 = (ASN1_OBJECT *)sk_ASN1_OBJECT_value((stack_st_ASN1_OBJECT *)x->reject,uStack_88);
        OBJ_obj2txt(local_78,0x50,pAVar3,0);
        BIO_puts(bp,local_78);
      }
      BIO_puts(bp,"\n");
    }
    if (x->alias != (ASN1_UTF8STRING *)0x0) {
      BIO_printf(bp,"%*sAlias: %.*s\n",(ulong)(uint)oidstr._76_4_,"",(ulong)(uint)x->alias->length,
                 x->alias->data);
    }
    if (x->keyid != (ASN1_OCTET_STRING *)0x0) {
      BIO_printf(bp,"%*sKey Id: ",(ulong)(uint)oidstr._76_4_,"");
      for (local_8c = 0; local_8c < x->keyid->length; local_8c = local_8c + 1) {
        pcVar4 = "";
        if (local_8c != 0) {
          pcVar4 = ":";
        }
        BIO_printf(bp,"%s%02X",pcVar4,(ulong)x->keyid->data[local_8c]);
      }
      BIO_write(bp,"\n",1);
    }
  }
  return 1;
}

Assistant:

int X509_CERT_AUX_print(BIO *out, X509_CERT_AUX *aux, int indent) {
  char oidstr[80], first;
  size_t i;
  int j;
  if (!aux) {
    return 1;
  }
  if (aux->trust) {
    first = 1;
    BIO_printf(out, "%*sTrusted Uses:\n%*s", indent, "", indent + 2, "");
    for (i = 0; i < sk_ASN1_OBJECT_num(aux->trust); i++) {
      if (!first) {
        BIO_puts(out, ", ");
      } else {
        first = 0;
      }
      OBJ_obj2txt(oidstr, sizeof oidstr, sk_ASN1_OBJECT_value(aux->trust, i),
                  0);
      BIO_puts(out, oidstr);
    }
    BIO_puts(out, "\n");
  } else {
    BIO_printf(out, "%*sNo Trusted Uses.\n", indent, "");
  }
  if (aux->reject) {
    first = 1;
    BIO_printf(out, "%*sRejected Uses:\n%*s", indent, "", indent + 2, "");
    for (i = 0; i < sk_ASN1_OBJECT_num(aux->reject); i++) {
      if (!first) {
        BIO_puts(out, ", ");
      } else {
        first = 0;
      }
      OBJ_obj2txt(oidstr, sizeof oidstr, sk_ASN1_OBJECT_value(aux->reject, i),
                  0);
      BIO_puts(out, oidstr);
    }
    BIO_puts(out, "\n");
  } else {
    BIO_printf(out, "%*sNo Rejected Uses.\n", indent, "");
  }
  if (aux->alias) {
    BIO_printf(out, "%*sAlias: %.*s\n", indent, "", aux->alias->length,
               aux->alias->data);
  }
  if (aux->keyid) {
    BIO_printf(out, "%*sKey Id: ", indent, "");
    for (j = 0; j < aux->keyid->length; j++) {
      BIO_printf(out, "%s%02X", j ? ":" : "", aux->keyid->data[j]);
    }
    BIO_write(out, "\n", 1);
  }
  return 1;
}